

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O2

void __thiscall
OpenMD::Utils::
AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>::
writeData(AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>
          *this,ostream *stream,string *errorMessage,DataHandling dataHandling)

{
  int i;
  ulong uVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> dat;
  _Vector_base<double,_std::allocator<double>_> local_58;
  size_t local_40;
  string *local_38;
  
  dat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dat.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_40 = (this->super_StdVectorAccumulator).Count_;
  local_38 = errorMessage;
  switch(dataHandling) {
  case Average:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_58,
               &(this->super_StdVectorAccumulator).Avg_);
    break;
  case Last:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_58,
               &(this->super_StdVectorAccumulator).Val_);
    break;
  case Max:
  case Min:
    memcpy(&painCave,"Max and Min functions are not defined for a std::vector Accumulator.",0x45);
    painCave.isFatal = 1;
    simError();
    goto switchD_00229f0c_default;
  case Total:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_58,
               &(this->super_StdVectorAccumulator).Total_);
    break;
  default:
    goto switchD_00229f0c_default;
  }
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&dat,&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
switchD_00229f0c_default:
  uVar1 = 0;
  while( true ) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_58,
               &(this->super_StdVectorAccumulator).Avg_);
    lVar2 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58._M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
    if ((ulong)(lVar2 >> 3) <= uVar1) break;
    if ((ulong)ABS(dat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1]) < 0x7ff0000000000000) {
      if (local_40 == 0) {
        std::operator<<(stream,'\t');
      }
      else {
        std::operator<<(stream,'\t');
        std::ostream::_M_insert<double>
                  (dat.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar1]);
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(local_38->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    uVar1 = uVar1 + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dat.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void writeData(std::ostream& stream, const std::string& errorMessage,
                   DataHandling dataHandling) const override {
      std::vector<RealType> dat;
      std::size_t count = StdVectorAccumulator::getCount();

      switch (dataHandling) {
      case DataHandling::Average:
        dat = StdVectorAccumulator::getAverage();
        break;
      case DataHandling::Last:
        dat = StdVectorAccumulator::getLastValue();
        break;
      case DataHandling::Total:
        dat = StdVectorAccumulator::getTotal();
        break;
      case DataHandling::Max:
      case DataHandling::Min:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Max and Min functions are not defined for a "
                 "std::vector Accumulator.");
        painCave.isFatal = 1;
        simError();
        break;
      default:
        break;
      }

      for (int i = 0; i < StdVectorAccumulator::getAverage().size(); i++) {
        if (std::isinf(dat[i]) || std::isnan(dat[i])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                   errorMessage.c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          if (count == 0)
            stream << '\t';
          else
            stream << '\t' << dat[i];
        }
      }
    }